

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetGreen
          (InstructionDisassembler *this,ostream *stream)

{
  char *pcVar1;
  green local_9;
  
  if (this->color_ == true) {
    local_9.isPrint = this->print_;
    pcVar1 = clr::green::operator_cast_to_char_(&local_9);
    std::operator<<(stream,pcVar1);
  }
  return;
}

Assistant:

void InstructionDisassembler::SetGreen(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::green{print_};
}